

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

void evsig_dealloc_(event_base *base)

{
  int iVar1;
  sigaction **ptr;
  long lVar2;
  
  if ((base->sig).ev_signal_added != 0) {
    event_del(&(base->sig).ev_signal);
    (base->sig).ev_signal_added = 0;
  }
  event_debug_unassign(&(base->sig).ev_signal);
  lVar2 = 0;
  do {
    if ((lVar2 < (base->sig).sh_old_max) && ((base->sig).sh_old[lVar2] != (sigaction *)0x0)) {
      evsig_restore_handler_(base,(int)lVar2);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x41);
  if (evsig_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,evsig_base_lock);
  }
  if (evsig_base == base) {
    evsig_base = (event_base *)0x0;
    evsig_base_n_signals_added = 0;
    evsig_base_fd = -1;
  }
  if (evsig_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,evsig_base_lock);
  }
  iVar1 = (base->sig).ev_signal_pair[0];
  if (iVar1 != -1) {
    evutil_closesocket(iVar1);
    (base->sig).ev_signal_pair[0] = -1;
  }
  iVar1 = (base->sig).ev_signal_pair[1];
  if (iVar1 != -1) {
    evutil_closesocket(iVar1);
    (base->sig).ev_signal_pair[1] = -1;
  }
  (base->sig).sh_old_max = 0;
  ptr = (base->sig).sh_old;
  if (ptr != (sigaction **)0x0) {
    event_mm_free_(ptr);
    (base->sig).sh_old = (sigaction **)0x0;
  }
  return;
}

Assistant:

void
evsig_dealloc_(struct event_base *base)
{
	int i = 0;
	if (base->sig.ev_signal_added) {
		event_del(&base->sig.ev_signal);
		base->sig.ev_signal_added = 0;
	}
	/* debug event is created in evsig_init_/event_assign even when
	 * ev_signal_added == 0, so unassign is required */
	event_debug_unassign(&base->sig.ev_signal);

	for (i = 0; i < NSIG; ++i) {
		if (i < base->sig.sh_old_max && base->sig.sh_old[i] != NULL)
			evsig_restore_handler_(base, i);
	}
	EVSIGBASE_LOCK();
	if (base == evsig_base) {
		evsig_base = NULL;
		evsig_base_n_signals_added = 0;
		evsig_base_fd = -1;
	}
	EVSIGBASE_UNLOCK();

	if (base->sig.ev_signal_pair[0] != -1) {
		evutil_closesocket(base->sig.ev_signal_pair[0]);
		base->sig.ev_signal_pair[0] = -1;
	}
	if (base->sig.ev_signal_pair[1] != -1) {
		evutil_closesocket(base->sig.ev_signal_pair[1]);
		base->sig.ev_signal_pair[1] = -1;
	}
	base->sig.sh_old_max = 0;

	/* per index frees are handled in evsig_del() */
	if (base->sig.sh_old) {
		mm_free(base->sig.sh_old);
		base->sig.sh_old = NULL;
	}
}